

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O2

void __thiscall
QTextOdfWriter::writeTableFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextTableFormat format,int formatIndex)

{
  int iVar1;
  char16_t *pcVar2;
  ulong uVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  bool bVar9;
  Alignment AVar10;
  storage_type *psVar11;
  QSharedDataPointer<QTextFormatPrivate> this_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar12;
  ulong uVar13;
  size_t sVar14;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QAnyStringView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QAnyStringView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QAnyStringView QVar22;
  QByteArrayView QVar23;
  QAnyStringView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QAnyStringView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QAnyStringView QVar30;
  QByteArrayView QVar31;
  QAnyStringView QVar32;
  QByteArrayView QVar33;
  QAnyStringView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QAnyStringView QVar40;
  QByteArrayView QVar41;
  QAnyStringView QVar42;
  QAnyStringView QVar43;
  QAnyStringView QVar44;
  QAnyStringView QVar45;
  QAnyStringView QVar46;
  QAnyStringView QVar47;
  QAnyStringView QVar48;
  QAnyStringView QVar49;
  QAnyStringView QVar50;
  QAnyStringView QVar51;
  QAnyStringView QVar52;
  QAnyStringView QVar53;
  QAnyStringView QVar54;
  QTextLength QVar55;
  QAnyStringView QVar56;
  QAnyStringView QVar57;
  QAnyStringView QVar58;
  QAnyStringView QVar59;
  QAnyStringView QVar60;
  QAnyStringView QVar61;
  QAnyStringView QVar62;
  QAnyStringView QVar63;
  long local_1a8;
  QArrayDataPointer<QTextLength> local_160;
  char16_t *local_148;
  ulong uStack_140;
  char16_t *local_138;
  ulong uStack_130;
  QArrayDataPointer<char16_t> local_128;
  QStringBuilder<QString,_QLatin1String> local_108;
  QAnyStringView local_e0;
  QByteArrayView local_d0;
  char16_t *local_c0;
  ulong uStack_b8;
  char *align;
  char16_t *local_a8;
  ulong uStack_a0;
  char16_t *local_98;
  ulong uStack_90;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  char16_t *local_50;
  ulong uStack_48;
  int formatIndex_local;
  long local_38;
  
  this_00.d.ptr = format.super_QTextFrameFormat.super_QTextFormat.d.d.ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = (this->styleNS).d.ptr;
  uVar13 = (this->styleNS).d.size;
  formatIndex_local = format.super_QTextFrameFormat.super_QTextFormat.format_type;
  psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("style",6);
  QVar15.m_data = psVar11;
  QVar15.m_size = (qsizetype)&local_108;
  QString::fromLatin1(QVar15);
  QVar16.m_size = (size_t)pcVar2;
  QVar16.field_0.m_data_utf8 = (char *)writer;
  QVar43.m_size = (size_t)local_108.a.d.ptr;
  QVar43.field_0.m_data = (void *)(uVar13 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar16,QVar43);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  pcVar2 = (this->styleNS).d.ptr;
  uVar13 = (this->styleNS).d.size;
  psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("name",5);
  QVar17.m_data = psVar11;
  QVar17.m_size = (qsizetype)&local_108;
  QString::fromLatin1(QVar17);
  pcVar6 = local_108.a.d.ptr;
  aVar12.m_data = (void *)(local_108.a.d.size | 0x8000000000000000);
  psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("Table%1",8);
  QVar18.m_data = psVar11;
  QVar18.m_size = (qsizetype)&local_88;
  QString::fromLatin1(QVar18);
  sVar14 = 0x20;
  QString::arg<int,_true>
            ((QString *)&local_68,(QString *)&local_88,
             format.super_QTextFrameFormat.super_QTextFormat.format_type,0,10,(QChar)0x20);
  local_50 = local_68.ptr;
  uStack_48 = local_68.size | 0x8000000000000000;
  QVar19.m_size = (size_t)pcVar2;
  QVar19.field_0.m_data_utf8 = (char *)writer;
  QVar44.m_size = (size_t)pcVar6;
  QVar44.field_0.m_data = (void *)(uVar13 | 0x8000000000000000);
  QVar56.m_size = sVar14;
  QVar56.field_0.m_data = aVar12.m_data;
  QXmlStreamWriter::writeAttribute(QVar19,QVar44,QVar56);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  pcVar2 = (this->styleNS).d.ptr;
  uVar13 = (this->styleNS).d.size;
  psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("family",7);
  QVar20.m_data = psVar11;
  QVar20.m_size = (qsizetype)&local_108;
  QString::fromLatin1(QVar20);
  pcVar6 = local_108.a.d.ptr;
  aVar12.m_data = (void *)(local_108.a.d.size | 0x8000000000000000);
  psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("table",6);
  QVar21.m_data = psVar11;
  QVar21.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar21);
  local_98 = local_68.ptr;
  uStack_90 = local_68.size | 0x8000000000000000;
  QVar22.m_size = (size_t)pcVar2;
  QVar22.field_0.m_data_utf8 = (char *)writer;
  QVar45.m_size = (size_t)pcVar6;
  QVar45.field_0.m_data = (void *)(uVar13 | 0x8000000000000000);
  QVar57.m_size = sVar14;
  QVar57.field_0.m_data = aVar12.m_data;
  QXmlStreamWriter::writeAttribute(QVar22,QVar45,QVar57);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  pcVar2 = (this->styleNS).d.ptr;
  uVar13 = (this->styleNS).d.size;
  psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("table-properties",0x11);
  QVar23.m_data = psVar11;
  QVar23.m_size = (qsizetype)&local_108;
  QString::fromLatin1(QVar23);
  QVar24.m_size = (size_t)pcVar2;
  QVar24.field_0.m_data_utf8 = (char *)writer;
  QVar46.m_size = (size_t)local_108.a.d.ptr;
  QVar46.field_0.m_data = (void *)(uVar13 | 0x8000000000000000);
  QXmlStreamWriter::writeEmptyElement(QVar24,QVar46);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  bVar9 = QHash<int,_QHashDummyValue>::contains
                    (&(this->m_tableFormatsWithBorders).q_hash,&formatIndex_local);
  if (bVar9) {
    pcVar2 = (this->tableNS).d.ptr;
    uVar13 = (this->tableNS).d.size;
    psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("border-model",0xd);
    QVar25.m_data = psVar11;
    QVar25.m_size = (qsizetype)&local_108;
    QString::fromLatin1(QVar25);
    pcVar6 = local_108.a.d.ptr;
    aVar12.m_data = (void *)(local_108.a.d.size | 0x8000000000000000);
    psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("collapsing",0xb);
    QVar26.m_data = psVar11;
    QVar26.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar26);
    local_a8 = local_68.ptr;
    uStack_a0 = local_68.size | 0x8000000000000000;
    QVar27.m_size = (size_t)pcVar2;
    QVar27.field_0.m_data_utf8 = (char *)writer;
    QVar47.m_size = (size_t)pcVar6;
    QVar47.field_0.m_data = (void *)(uVar13 | 0x8000000000000000);
    QVar58.m_size = sVar14;
    QVar58.field_0.m_data = aVar12.m_data;
    QXmlStreamWriter::writeAttribute(QVar27,QVar47,QVar58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  }
  align = (char *)0x0;
  AVar10 = QTextTableFormat::alignment((QTextTableFormat *)this_00.d.ptr);
  switch(AVar10.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i) {
  case (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x1:
    align = "left";
    break;
  case (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x2:
    align = "right";
    break;
  default:
    goto switchD_005264c0_caseD_3;
  case (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x4:
    align = "center";
    break;
  case (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x8:
    align = "margins";
  }
  pcVar2 = (this->tableNS).d.ptr;
  uVar13 = (this->tableNS).d.size;
  psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("align",6);
  QVar28.m_data = psVar11;
  QVar28.m_size = (qsizetype)&local_108;
  QString::fromLatin1(QVar28);
  pcVar6 = local_108.a.d.ptr;
  aVar12.m_data = (void *)(local_108.a.d.size | 0x8000000000000000);
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_d0,&align);
  QVar29.m_data = (storage_type *)local_d0.m_size;
  QVar29.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar29);
  local_c0 = local_68.ptr;
  uStack_b8 = local_68.size | 0x8000000000000000;
  QVar30.m_size = (size_t)pcVar2;
  QVar30.field_0.m_data_utf8 = (char *)writer;
  QVar48.m_size = (size_t)pcVar6;
  QVar48.field_0.m_data = (void *)(uVar13 | 0x8000000000000000);
  QVar59.m_size = sVar14;
  QVar59.field_0.m_data = aVar12.m_data;
  QXmlStreamWriter::writeAttribute(QVar30,QVar48,QVar59);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
switchD_005264c0_caseD_3:
  QVar55 = QTextFrameFormat::width((QTextFrameFormat *)this_00.d.ptr);
  if ((QVar55.fixedValueOrPercentage != 0.0) || (NAN(QVar55.fixedValueOrPercentage))) {
    pcVar2 = (this->styleNS).d.ptr;
    uVar13 = (this->styleNS).d.size;
    psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("width",6);
    QVar31.m_data = psVar11;
    QVar31.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar31);
    pcVar6 = local_68.ptr;
    aVar12.m_data = (void *)(local_68.size | 0x8000000000000000);
    QVar55 = QTextFrameFormat::width((QTextFrameFormat *)this_00.d.ptr);
    QString::number(QVar55.fixedValueOrPercentage,(char)&local_88,0x67);
    local_108.a.d.size = local_88.size;
    local_108.a.d.ptr = local_88.ptr;
    local_108.a.d.d = local_88.d;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    local_108.b.m_size = 2;
    local_108.b.m_data = "pt";
    local_128.d = (Data *)0x0;
    local_128.ptr = (char16_t *)0x0;
    local_128.size = 0;
    QAnyStringView::QAnyStringView<QStringBuilder<QString,_QLatin1String>,_true>
              (&local_e0,&local_108,
               (wrapped_t<QStringBuilder<QString,_QLatin1String>,_QString> *)&local_128);
    QVar32.m_size = (size_t)pcVar2;
    QVar32.field_0.m_data_utf8 = (char *)writer;
    QVar49.m_size = (size_t)pcVar6;
    QVar49.field_0.m_data = (void *)(uVar13 | 0x8000000000000000);
    QVar60.m_size = sVar14;
    QVar60.field_0.m_data = aVar12.m_data;
    QXmlStreamWriter::writeAttribute(QVar32,QVar49,QVar60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  QXmlStreamWriter::writeEndElement();
  QTextTableFormat::columnWidthConstraints
            ((QList<QTextLength> *)&local_108,(QTextTableFormat *)this_00.d.ptr);
  qVar7 = local_108.a.d.size;
  QArrayDataPointer<QTextLength>::~QArrayDataPointer((QArrayDataPointer<QTextLength> *)&local_108);
  if (qVar7 != 0) {
    QSet<int>::insert((QSet<int> *)&local_108,(int *)&this->m_tableFormatsWithColWidthConstraints);
    local_1a8 = 0;
    uVar13 = 0;
    while( true ) {
      QTextTableFormat::columnWidthConstraints
                ((QList<QTextLength> *)&local_108,(QTextTableFormat *)this_00.d.ptr);
      qVar7 = local_108.a.d.size;
      QArrayDataPointer<QTextLength>::~QArrayDataPointer
                ((QArrayDataPointer<QTextLength> *)&local_108);
      if ((ulong)qVar7 <= uVar13) break;
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("style",6);
      QVar33.m_data = psVar11;
      QVar33.m_size = (qsizetype)&local_108;
      QString::fromLatin1(QVar33);
      QVar34.m_size = (size_t)pcVar2;
      QVar34.field_0.m_data_utf8 = (char *)writer;
      QVar50.m_size = (size_t)local_108.a.d.ptr;
      QVar50.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QXmlStreamWriter::writeStartElement(QVar34,QVar50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("name",5);
      QVar35.m_data = psVar11;
      QVar35.m_size = (qsizetype)&local_108;
      QString::fromLatin1(QVar35);
      pcVar6 = local_108.a.d.ptr;
      aVar12.m_data = (void *)(local_108.a.d.size | 0x8000000000000000);
      psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("Table%1.%2",0xb);
      QVar36.m_data = psVar11;
      QVar36.m_size = (qsizetype)&local_128;
      QString::fromLatin1(QVar36);
      QString::arg<int,_true>
                ((QString *)&local_88,(QString *)&local_128,formatIndex_local,0,10,(QChar)0x20);
      sVar14 = 0x20;
      QString::arg<int,_true>
                ((QString *)&local_68,(QString *)&local_88,(int)uVar13,0,10,(QChar)0x20);
      local_138 = local_68.ptr;
      uStack_130 = local_68.size | 0x8000000000000000;
      QVar4.m_size = (size_t)pcVar2;
      QVar4.field_0.m_data_utf8 = (char *)writer;
      QVar51.m_size = (size_t)pcVar6;
      QVar51.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QVar61.m_size = sVar14;
      QVar61.field_0.m_data = aVar12.m_data;
      QXmlStreamWriter::writeAttribute(QVar4,QVar51,QVar61);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("family",7);
      QVar37.m_data = psVar11;
      QVar37.m_size = (qsizetype)&local_108;
      QString::fromLatin1(QVar37);
      pcVar6 = local_108.a.d.ptr;
      aVar12.m_data = (void *)(local_108.a.d.size | 0x8000000000000000);
      psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("table-column",0xd);
      QVar38.m_data = psVar11;
      QVar38.m_size = (qsizetype)&local_68;
      QString::fromLatin1(QVar38);
      local_148 = local_68.ptr;
      uStack_140 = local_68.size | 0x8000000000000000;
      QVar5.m_size = (size_t)pcVar2;
      QVar5.field_0.m_data_utf8 = (char *)writer;
      QVar52.m_size = (size_t)pcVar6;
      QVar52.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QVar62.m_size = sVar14;
      QVar62.field_0.m_data = aVar12.m_data;
      QXmlStreamWriter::writeAttribute(QVar5,QVar52,QVar62);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      psVar11 = (storage_type *)
                QByteArrayView::lengthHelperCharArray("table-column-properties",0x18);
      QVar39.m_data = psVar11;
      QVar39.m_size = (qsizetype)&local_108;
      QString::fromLatin1(QVar39);
      QVar40.m_size = (size_t)pcVar2;
      QVar40.field_0.m_data_utf8 = (char *)writer;
      QVar53.m_size = (size_t)local_108.a.d.ptr;
      QVar53.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QXmlStreamWriter::writeEmptyElement(QVar40,QVar53);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      local_68.size = 0;
      QTextTableFormat::columnWidthConstraints
                ((QList<QTextLength> *)&local_108,(QTextTableFormat *)this_00.d.ptr);
      iVar1 = *(int *)((long)local_108.a.d.ptr + local_1a8);
      QArrayDataPointer<QTextLength>::~QArrayDataPointer
                ((QArrayDataPointer<QTextLength> *)&local_108);
      if (iVar1 == 2) {
        QTextTableFormat::columnWidthConstraints
                  ((QList<QTextLength> *)&local_160,(QTextTableFormat *)this_00.d.ptr);
        QString::number(*(double *)((long)&(local_160.ptr)->fixedValueOrPercentage + local_1a8),
                        (char)&local_128,0x67);
        local_108.a.d.size = local_128.size;
        local_108.a.d.ptr = local_128.ptr;
        local_108.a.d.d = local_128.d;
        local_128.d = (Data *)0x0;
        local_128.ptr = (char16_t *)0x0;
        local_128.size = 0;
        local_108.b.m_size = 1;
        local_108.b.m_data = "%";
        QStringBuilder<QString,_QLatin1String>::convertTo<QString>((QString *)&local_88,&local_108);
        qVar7 = local_68.size;
        pcVar2 = local_68.ptr;
        pDVar8 = local_68.d;
        local_68.d = local_88.d;
        local_68.ptr = local_88.ptr;
        local_88.d = pDVar8;
        local_88.ptr = pcVar2;
        local_68.size = local_88.size;
        local_88.size = qVar7;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      }
      else {
        QTextTableFormat::columnWidthConstraints
                  ((QList<QTextLength> *)&local_108,(QTextTableFormat *)this_00.d.ptr);
        iVar1 = *(int *)((long)local_108.a.d.ptr + local_1a8);
        QArrayDataPointer<QTextLength>::~QArrayDataPointer
                  ((QArrayDataPointer<QTextLength> *)&local_108);
        if (iVar1 == 1) {
          QTextTableFormat::columnWidthConstraints
                    ((QList<QTextLength> *)&local_160,(QTextTableFormat *)this_00.d.ptr);
          QString::number(*(double *)((long)&(local_160.ptr)->fixedValueOrPercentage + local_1a8),
                          (char)&local_128,0x67);
          local_108.a.d.d = local_128.d;
          local_108.a.d.ptr = local_128.ptr;
          local_108.a.d.size = local_128.size;
          local_108.b.m_size = 2;
          local_108.b.m_data = "pt";
        }
        else {
          QTextTableFormat::columnWidthConstraints
                    ((QList<QTextLength> *)&local_160,(QTextTableFormat *)this_00.d.ptr);
          QString::number((longlong)&local_128,(int)(100 / (ulong)local_160.size));
          local_108.a.d.d = local_128.d;
          local_108.a.d.ptr = local_128.ptr;
          local_108.a.d.size = local_128.size;
          local_108.b.m_size = 1;
          local_108.b.m_data = "%";
        }
        local_128.size = 0;
        local_128.ptr = (char16_t *)0x0;
        local_128.d = (Data *)0x0;
        QStringBuilder<QString,_QLatin1String>::convertTo<QString>((QString *)&local_88,&local_108);
        qVar7 = local_68.size;
        pcVar2 = local_68.ptr;
        pDVar8 = local_68.d;
        local_68.d = local_88.d;
        local_68.ptr = local_88.ptr;
        local_88.d = pDVar8;
        local_88.ptr = pcVar2;
        local_68.size = local_88.size;
        local_88.size = qVar7;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      }
      QArrayDataPointer<QTextLength>::~QArrayDataPointer(&local_160);
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("column-width",0xd);
      QVar41.m_data = psVar11;
      QVar41.m_size = (qsizetype)&local_108;
      QString::fromLatin1(QVar41);
      QVar63.field_0.m_data = (void *)(local_108.a.d.size | 0x8000000000000000);
      QVar42.m_size = (size_t)pcVar2;
      QVar42.field_0.m_data_utf8 = (char *)writer;
      QVar54.m_size = (size_t)local_108.a.d.ptr;
      QVar54.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QVar63.m_size = sVar14;
      QXmlStreamWriter::writeAttribute(QVar42,QVar54,QVar63);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
      QXmlStreamWriter::writeEndElement();
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      uVar13 = uVar13 + 1;
      local_1a8 = local_1a8 + 0x10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOdfWriter::writeTableFormat(QXmlStreamWriter &writer, QTextTableFormat format, int formatIndex) const
{
    // start writing table style element
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                          QString::fromLatin1("Table%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table"));
    writer.writeEmptyElement(styleNS, QString::fromLatin1("table-properties"));

    if (m_tableFormatsWithBorders.contains(formatIndex)) {
        // write border format collapsing to table style
        writer.writeAttribute(tableNS, QString::fromLatin1("border-model"),
                              QString::fromLatin1("collapsing"));
    }
    const char* align = nullptr;
    switch (format.alignment()) {
    case Qt::AlignLeft:
        align = "left";
        break;
    case Qt::AlignRight:
        align = "right";
        break;
    case Qt::AlignHCenter:
        align = "center";
        break;
    case Qt::AlignJustify:
        align = "margins";
        break;
    }
    if (align)
       writer.writeAttribute(tableNS, QString::fromLatin1("align"), QString::fromLatin1(align));
    if (format.width().rawValue()) {
        writer.writeAttribute(styleNS, QString::fromLatin1("width"),
                              QString::number(format.width().rawValue()) + "pt"_L1);
    }
    writer.writeEndElement();
    // start writing table-column style element
    if (format.columnWidthConstraints().size()) {
        // write table-column-properties for columns with constraints
        m_tableFormatsWithColWidthConstraints.insert(formatIndex); // needed for linking of columns to styles
        for (int colit = 0; colit < format.columnWidthConstraints().size(); ++colit) {
            writer.writeStartElement(styleNS, QString::fromLatin1("style"));
            writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                                  QString::fromLatin1("Table%1.%2").arg(formatIndex).arg(colit));
            writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table-column"));
            writer.writeEmptyElement(styleNS, QString::fromLatin1("table-column-properties"));
            QString columnWidth;
            if (format.columnWidthConstraints().at(colit).type() == QTextLength::PercentageLength) {
                columnWidth = QString::number(format.columnWidthConstraints().at(colit).rawValue())
                        + "%"_L1;
            } else if (format.columnWidthConstraints().at(colit).type() == QTextLength::FixedLength) {
                columnWidth = QString::number(format.columnWidthConstraints().at(colit).rawValue())
                        + "pt"_L1;
            } else {
                //!! HARD-CODING variableWidth Constraints to 100% / nr constraints
                columnWidth = QString::number(100 / format.columnWidthConstraints().size())
                                      + "%"_L1;
            }
            writer.writeAttribute(styleNS, QString::fromLatin1("column-width"), columnWidth);
            writer.writeEndElement();
        }
    }
}